

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O0

void __thiscall
deqp::egl::Image::GLES2ImageApi::GLES2ImageApi
          (GLES2ImageApi *this,Library *egl,Functions *gl,int contextId,TestLog *log,
          EGLDisplay display,EGLSurface surface,EGLConfig config)

{
  Library *pLVar1;
  EGLSurface pvVar2;
  deUint32 dVar3;
  deBool dVar4;
  int iVar5;
  TestLog *this_00;
  MessageBuilder *pMVar6;
  undefined4 extraout_var;
  MessageBuilder local_1d8;
  int local_54;
  undefined8 uStack_50;
  EGLint configId;
  EGLint attriblist [3];
  EGLDisplay display_local;
  TestLog *log_local;
  int contextId_local;
  Functions *gl_local;
  Library *egl_local;
  GLES2ImageApi *this_local;
  
  ImageApi::ImageApi(&this->super_ImageApi,egl,contextId,display,surface);
  glu::CallLogWrapper::CallLogWrapper(&this->super_CallLogWrapper,gl,log);
  (this->super_ImageApi)._vptr_ImageApi = (_func_int **)&PTR__GLES2ImageApi_0327e958;
  this->m_context = (EGLContext)0x0;
  this->m_gl = gl;
  uStack_50 = 0x200003098;
  attriblist[0] = 0x3038;
  local_54 = -1;
  do {
    pLVar1 = (this->super_ImageApi).m_egl;
    (*pLVar1->_vptr_Library[0x19])(pLVar1,(this->super_ImageApi).m_display,config,0x3028,&local_54);
    dVar3 = (*((this->super_ImageApi).m_egl)->_vptr_Library[0x1f])();
    eglu::checkError(dVar3,"getConfigAttrib(m_display, config, EGL_CONFIG_ID, &configId)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                     ,0x123);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  this_00 = glu::CallLogWrapper::getLog(&this->super_CallLogWrapper);
  tcu::TestLog::operator<<(&local_1d8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar6 = tcu::MessageBuilder::operator<<
                     (&local_1d8,(char (*) [40])"Creating gles2 context with config id: ");
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_54);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [11])0x2b529a8);
  pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&(this->super_ImageApi).m_contextId);
  tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1d8);
  (**egl->_vptr_Library)(egl,0x30a0);
  pLVar1 = (this->super_ImageApi).m_egl;
  iVar5 = (*pLVar1->_vptr_Library[6])
                    (pLVar1,(this->super_ImageApi).m_display,config,0,&stack0xffffffffffffffb0);
  this->m_context = (EGLContext)CONCAT44(extraout_var,iVar5);
  dVar3 = (*((this->super_ImageApi).m_egl)->_vptr_Library[0x1f])();
  eglu::checkError(dVar3,"Failed to create GLES2 context",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                   ,0x127);
  pvVar2 = (this->super_ImageApi).m_surface;
  (*egl->_vptr_Library[0x27])(egl,display,pvVar2,pvVar2,this->m_context);
  dVar3 = (*((this->super_ImageApi).m_egl)->_vptr_Library[0x1f])();
  eglu::checkError(dVar3,"Failed to make context current",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageFormatTests.cpp"
                   ,0x12a);
  return;
}

Assistant:

GLES2ImageApi::GLES2ImageApi (const Library& egl, const glw::Functions& gl, int contextId, tcu::TestLog& log, EGLDisplay display, EGLSurface surface, EGLConfig config)
	: ImageApi				(egl, contextId, display, surface)
	, glu::CallLogWrapper	(gl, log)
	, m_context				(DE_NULL)
	, m_gl					(gl)
{
	const EGLint attriblist[] =
	{
		EGL_CONTEXT_CLIENT_VERSION, 2,
		EGL_NONE
	};

	EGLint configId = -1;
	EGLU_CHECK_CALL(m_egl, getConfigAttrib(m_display, config, EGL_CONFIG_ID, &configId));
	getLog() << tcu::TestLog::Message << "Creating gles2 context with config id: " << configId << " context: " << m_contextId << tcu::TestLog::EndMessage;
	egl.bindAPI(EGL_OPENGL_ES_API);
	m_context = m_egl.createContext(m_display, config, EGL_NO_CONTEXT, attriblist);
	EGLU_CHECK_MSG(m_egl, "Failed to create GLES2 context");

	egl.makeCurrent(display, m_surface, m_surface, m_context);
	EGLU_CHECK_MSG(m_egl, "Failed to make context current");
}